

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_movep_er(m68k_info *info,int size)

{
  uint uVar1;
  cs_m68k *pcVar2;
  undefined4 in_ESI;
  long in_RDI;
  cs_m68k *ext;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  undefined8 in_stack_ffffffffffffffe0;
  m68k_info *info_00;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  pcVar2 = build_init_op((m68k_info *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                         (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                         (int)in_stack_ffffffffffffffe8,
                         (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  info_00 = (m68k_info *)(pcVar2->operands + 1);
  pcVar2->operands[0].address_mode = M68K_AM_REGI_ADDR_DISP;
  pcVar2->operands[0].type = M68K_OP_MEM;
  pcVar2->operands[0].mem.base_reg = (*(uint *)(in_RDI + 0x24) & 7) + M68K_REG_A0;
  uVar1 = read_imm_16(info_00);
  pcVar2->operands[0].mem.disp = (int16_t)uVar1;
  *(uint *)&info_00->code = (*(uint *)(in_RDI + 0x24) >> 9 & 7) + 1;
  return;
}

Assistant:

static void build_movep_er(m68k_info *info, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, M68K_INS_MOVEP, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->address_mode = M68K_AM_REGI_ADDR_DISP;
	op0->type = M68K_OP_MEM;
	op0->mem.base_reg = M68K_REG_A0 + (info->ir & 7);
	op0->mem.disp = (int16_t)read_imm_16(info);

	op1->reg = M68K_REG_D0 + ((info->ir >> 9) & 7);
}